

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O0

bool absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<signed_char>
               (Data arg,FormatConversionSpecImpl spec,void *out)

{
  FormatConversionChar FVar1;
  bool bVar2;
  char cVar3;
  IntegralConvertResult IVar4;
  FormatConversionCharSet set;
  FormatSinkImpl *in_R8;
  FormatConversionSpecImpl conv;
  void *out_local;
  undefined1 local_24 [8];
  FormatConversionSpecImpl spec_local;
  Data arg_local;
  
  spec_local._0_4_ = spec.precision_;
  local_24 = spec._0_8_;
  spec_local._4_8_ = arg;
  FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)local_24);
  if (FVar1 == 0x13) {
    arg_local.buf[7] = ToInt<signed_char>(spec_local._4_8_,out);
  }
  else {
    set = ArgumentToConv<signed_char>();
    FVar1 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)local_24);
    bVar2 = Contains(set,FVar1);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      cVar3 = Manager<signed_char,_(absl::lts_20250127::str_format_internal::FormatArgImpl::StoragePolicy)2>
              ::Value((Data)spec_local._4_8_);
      conv.width_ = 0;
      conv.conv_ = spec_local.conv_;
      conv.flags_ = spec_local.flags_;
      conv.length_mod_ = spec_local.length_mod_;
      conv._3_1_ = spec_local._3_1_;
      conv.precision_ = (int)out;
      IVar4 = str_format_internal::FormatConvertImpl
                        ((str_format_internal *)(ulong)(uint)(int)cVar3,local_24[0],conv,in_R8);
      arg_local.buf[7] = IVar4.value & 1;
    }
    else {
      arg_local.buf[7] = '\0';
    }
  }
  return (bool)arg_local.buf[7];
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }